

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* list_dirs(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *__return_storage_ptr__,string *path)

{
  bool bVar1;
  path *ppVar2;
  string_type local_f0;
  directory_entry *local_d0;
  directory_entry *p;
  undefined1 local_b8 [8];
  directory_iterator __end1;
  undefined1 local_98 [8];
  directory_iterator __begin1;
  path local_78;
  directory_iterator local_38;
  directory_iterator *local_28;
  directory_iterator *__range1;
  string *local_18;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  __range1._7_1_ = 0;
  local_18 = path;
  path_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_78,path);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            (&local_38,&local_78);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_78);
  local_28 = &local_38;
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,local_28);
  std::experimental::filesystem::v1::__cxx11::begin
            ((__cxx11 *)local_98,
             (directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)
             &__end1._M_dir.
              super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&p,local_28);
  std::experimental::filesystem::v1::__cxx11::end((directory_iterator *)local_b8);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&p);
  while (bVar1 = std::experimental::filesystem::v1::__cxx11::operator!=
                           ((directory_iterator *)local_98,(directory_iterator *)local_b8), bVar1) {
    local_d0 = (directory_entry *)
               std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)local_98);
    ppVar2 = std::experimental::filesystem::v1::__cxx11::directory_entry::operator_cast_to_path_
                       (local_d0);
    bVar1 = std::experimental::filesystem::v1::is_directory(ppVar2);
    if (bVar1) {
      ppVar2 = std::experimental::filesystem::v1::__cxx11::directory_entry::path(local_d0);
      std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string(&local_f0,ppVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++
              ((directory_iterator *)local_98);
  }
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)local_b8);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)local_98);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::~directory_iterator(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> list_dirs(std::string path) {
    std::vector<std::string> result;
    for (auto & p : fs::directory_iterator(path)) {
        if (fs::is_directory(p)) {
            result.push_back(std::string(p.path()));
        }
    }
    return result;
}